

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VDotProdMulti(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  undefined8 uVar1;
  SUNErrCode ier;
  int i;
  undefined4 local_28;
  undefined4 local_24;
  
  if (*(long *)(*(long *)(in_RSI + 8) + 0x100) == 0) {
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      uVar1 = (**(code **)(*(long *)(in_RSI + 8) + 0x98))
                        (in_RSI,*(undefined8 *)(in_RDX + (long)local_24 * 8));
      *(undefined8 *)(in_RCX + (long)local_24 * 8) = uVar1;
    }
    local_28 = 0;
  }
  else {
    local_28 = (**(code **)(*(long *)(in_RSI + 8) + 0x100))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_28;
}

Assistant:

SUNErrCode N_VDotProdMulti(int nvec, N_Vector x, N_Vector* Y,
                           sunrealtype* dotprods)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  if (x->ops->nvdotprodmulti != NULL)
  {
    ier = x->ops->nvdotprodmulti(nvec, x, Y, dotprods);
  }
  else
  {
    for (i = 0; i < nvec; i++) { dotprods[i] = x->ops->nvdotprod(x, Y[i]); }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}